

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

char * ucnv_getCanonicalName_63(char *alias,char *standard,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint32_t uVar2;
  uint32_t convNum;
  UErrorCode *pErrorCode_local;
  char *standard_local;
  char *alias_local;
  
  UVar1 = haveAliasData(pErrorCode);
  if (((UVar1 == '\0') || (UVar1 = isAlias(alias,pErrorCode), UVar1 == '\0')) ||
     (uVar2 = findTaggedConverterNum(alias,standard,pErrorCode),
     gMainTable.converterListSize <= uVar2)) {
    alias_local = (char *)0x0;
  }
  else {
    alias_local = (char *)(gMainTable.stringTable + (int)(uint)gMainTable.converterList[uVar2]);
  }
  return alias_local;
}

Assistant:

U_CAPI const char * U_EXPORT2
ucnv_getCanonicalName(const char *alias, const char *standard, UErrorCode *pErrorCode) {
    if (haveAliasData(pErrorCode) && isAlias(alias, pErrorCode)) {
        uint32_t convNum = findTaggedConverterNum(alias, standard, pErrorCode);

        if (convNum < gMainTable.converterListSize) {
            return GET_STRING(gMainTable.converterList[convNum]);
        }
    }

    return NULL;
}